

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O1

errno_t rand_s(uint *randomValue)

{
  int iVar1;
  ulong uVar2;
  ssize_t sVar3;
  uint uVar4;
  bool bVar5;
  Lock local_31;
  
  if (randomValue == (uint *)0x0) {
    return 1;
  }
  if (GetRandom(unsigned_int*)::mutex_initialized == '\0') {
    rand_s_cold_1();
  }
  if (GetRandom(unsigned_int*)::mutex_initialized == '\0') {
    fprintf(_stderr,"pthread_mutex_init has failed");
    abort();
  }
  Lock::Lock(&local_31);
  uVar2 = (ulong)cache_index;
  if (uVar2 < 8) {
    cache_index = cache_index + 1;
    uVar4 = random_cache.result[uVar2];
  }
  else {
    uVar2 = 0;
    iVar1 = open64("/dev/urandom",0);
    do {
      sVar3 = read(iVar1,(void *)((long)&random_cache + uVar2),(ulong)(0x20 - (int)uVar2));
      if ((int)sVar3 < 0) {
        bVar5 = true;
        close(iVar1);
        goto LAB_002d2ed2;
      }
      uVar4 = (int)uVar2 + (int)sVar3;
      uVar2 = (ulong)uVar4;
    } while (uVar4 < 0x20);
    close(iVar1);
    *randomValue = random_cache.result[0];
    bVar5 = uVar4 != 0x20;
LAB_002d2ed2:
    if (!bVar5) {
      cache_index = 1;
      goto LAB_002d2ef9;
    }
    iVar1 = rand();
    WEAK_RANDOM_SEED = WEAK_RANDOM_SEED + iVar1;
    uVar4 = rand_r(&WEAK_RANDOM_SEED);
  }
  *randomValue = uVar4;
LAB_002d2ef9:
  Lock::~Lock(&local_31);
  return 0;
}

Assistant:

errno_t __cdecl rand_s(unsigned int* randomValue) noexcept
{
    if (randomValue == nullptr) return 1;

    GetRandom(randomValue);
    return 0;
}